

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIndent.cxx
# Opt level: O3

int __thiscall kws::Parser::GetCurrentIdent(Parser *this,string *line,char type)

{
  size_type sVar1;
  size_type sVar2;
  
  sVar1 = line->_M_string_length;
  if (sVar1 == 0) {
    return 0;
  }
  sVar2 = 0;
  do {
    if ((line->_M_dataplus)._M_p[sVar2] != type) {
      return (int)sVar2;
    }
    sVar2 = sVar2 + 1;
  } while (sVar1 != sVar2);
  return (int)sVar1;
}

Assistant:

int Parser::GetCurrentIdent(std::string line,char type)
{
  int indent = 0;
  std::string::const_iterator it = line.begin();
  while(it != line.end() && (*it)== type)
    {
    indent++;
    it++;
    }
  return indent;
}